

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EcMasterlibMain.cpp
# Opt level: O0

int mainEtherCAT(int nArgc,char **ppArgv)

{
  bool bVar1;
  EC_T_CHAR *pEVar2;
  EC_T_DWORD EVar3;
  uint __seed;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  EC_T_LINK_PARMS *local_9e8;
  int local_98c;
  int local_988;
  EC_T_INT nPtcWordIndex_1;
  EC_T_INT nPtcWordIndex;
  EC_T_BOOL bIsFileName;
  EC_T_CHAR szStrFormat [3];
  char *pcStack_978;
  EC_T_INT nStrRemain;
  EC_T_CHAR *pcStrCur;
  undefined1 local_968 [4];
  int nSigNum;
  sigset_t SigSet;
  char *licenseKey;
  EC_T_BOOL bCtlOff;
  EC_T_DCM_MODE eDcmMode;
  EC_T_OS_PARMS oOsParms;
  EC_T_INT nVerbose;
  EC_T_BOOL bStartTimingTask;
  EC_T_TIMING_DESC TimingDesc;
  EC_T_BOOL bEnaPerfJobs;
  EC_T_CPUSET CpuSet;
  EC_T_DWORD dwCpuIndex;
  CAtEmLogging oLogging;
  EC_T_LINK_PARMS *pEStack_6c8;
  EC_T_WORD wServerPort;
  EC_T_LINK_PARMS *apLinkParms [5];
  EC_T_DWORD dwNumLinkLayer;
  EC_T_DWORD dwDuration;
  EC_T_CHAR szENIFilename [256];
  EC_T_DWORD local_58c;
  EC_T_DWORD *pEStack_588;
  EC_T_DWORD dwCnfDataLen;
  EC_T_PBYTE pbyCnfData;
  EC_T_CHAR local_578 [4];
  EC_T_CNF_TYPE eCnfType;
  EC_T_CHAR szLogFileprefix [256];
  EC_T_CHAR local_469;
  EC_T_CHAR *pEStack_468;
  EC_T_CHAR tcStorage;
  EC_T_CHAR *ptcWord;
  char local_458 [4];
  EC_T_BOOL bGetNextWord;
  EC_T_CHAR szFullCommandLine [512];
  EC_T_CHAR szCommandLine [512];
  EC_T_BOOL bLogInitialized;
  EC_T_DWORD dwRes;
  int nRetVal;
  char **ppArgv_local;
  int nArgc_local;
  
  bLogInitialized = -1;
  bVar1 = false;
  ptcWord._4_4_ = 1;
  pEStack_468 = (EC_T_CHAR *)0x0;
  local_469 = '\0';
  memset(local_578,0,0x100);
  pEStack_588 = (EC_T_DWORD *)0x0;
  local_58c = 0;
  memset(&dwNumLinkLayer,0,0x100);
  apLinkParms[4]._4_4_ = 0;
  apLinkParms[4]._0_4_ = 0;
  oLogging.m_pchLogDir[0xfe] = -1;
  oLogging.m_pchLogDir[0xff] = -1;
  CAtEmLogging::CAtEmLogging((CAtEmLogging *)&CpuSet);
  bEnaPerfJobs = 0;
  TimingDesc._36_4_ = 0;
  oOsParms.pfHwTimerModifyInitialCount._4_4_ = 0;
  oOsParms.pfHwTimerModifyInitialCount._0_4_ = 0;
  licenseKey._4_4_ = eDcmMode_BusShift;
  licenseKey._0_4_ = 0;
  SigSet.__val[0xf] = (long)"\n" + 1;
  memset(&stack0xfffffffffffff938,0,0x28);
  memset(&nVerbose,0,0x28);
  memset(&bCtlOff,0,0x28);
  szFullCommandLine[0x1f8] = '\0';
  eDcmMode = 0x28;
  oOsParms.pfSystemTimeGet._0_4_ = 0xffffffff;
  EVar3 = EnableRealtimeEnvironment();
  if (EVar3 == 0) {
    sigemptyset((sigset_t *)local_968);
    sigaddset((sigset_t *)local_968,0xe);
    sigprocmask(0,(sigset_t *)local_968,(sigset_t *)0x0);
    __seed = OsQueryMsecCount();
    srand(__seed);
    bRun = 1;
    OsAddDbgMsgHook(CAtEmLogging::OsDbgMsgHookWrapper);
    TimingDesc.pvTimingEvent._4_4_ = 0;
    TimingDesc.dwBusCycleTimeUsec = 0;
    poVar6 = std::operator<<((ostream *)&std::cout,"ECMASTERLIB: CYCLE_TIME: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    TimingDesc.pvTimingEvent._0_4_ = 1000;
    pcStack_978 = szFullCommandLine + 0x1f8;
    bIsFileName = 0x200;
    nPtcWordIndex._1_2_ = 0x7325;
    nPtcWordIndex._3_1_ = 0;
    _dwRes = ppArgv + 1;
    for (ppArgv_local._4_4_ = nArgc + -1; 0 < ppArgv_local._4_4_;
        ppArgv_local._4_4_ = ppArgv_local._4_4_ + -1) {
      EcSnprintf(pcStack_978,bIsFileName + -1,(long)&nPtcWordIndex + 1,*_dwRes);
      iVar4 = strcmp(pcStack_978,"-f");
      sVar7 = strlen(pcStack_978);
      pcVar9 = pcStack_978;
      bIsFileName = bIsFileName - (int)sVar7;
      sVar7 = strlen(pcStack_978);
      pcStack_978 = pcVar9 + sVar7;
      strncpy(pcStack_978," ",(long)(bIsFileName + -1));
      iVar5 = bIsFileName + -1;
      pcStack_978 = pcStack_978 + 1;
      if ((iVar4 == 0) && (1 < ppArgv_local._4_4_)) {
        ppArgv_local._4_4_ = ppArgv_local._4_4_ + -1;
        _dwRes = _dwRes + 1;
        iVar4 = bIsFileName + -2;
        bIsFileName = iVar5;
        strncpy(pcStack_978,"\"",(long)iVar4);
        pcStack_978 = pcStack_978 + 1;
        iVar5 = bIsFileName + -2;
        bIsFileName = bIsFileName + -1;
        EcSnprintf(pcStack_978,iVar5,(long)&nPtcWordIndex + 1,*_dwRes);
        sVar7 = strlen(pcStack_978);
        pcVar9 = pcStack_978;
        bIsFileName = bIsFileName - (int)sVar7;
        sVar7 = strlen(pcStack_978);
        pcStack_978 = pcVar9 + sVar7;
        strncpy(pcStack_978,"\" ",(long)(bIsFileName + -1));
        pcStack_978 = pcStack_978 + 1;
        iVar5 = bIsFileName + -1;
      }
      bIsFileName = iVar5;
      _dwRes = _dwRes + 1;
    }
    strncpy(local_458,szFullCommandLine + 0x1f8,0x1ff);
    pEStack_468 = strtok(szFullCommandLine + 0x1f8," ");
    while (pEStack_468 != (char *)0x0) {
      iVar5 = strcasecmp(pEStack_468,"-f");
      if (iVar5 == 0) {
        for (local_988 = 3;
            ((pEStack_468[local_988] != '\0' && (pEStack_468[local_988] != '\"')) &&
            (pEStack_468[local_988] == ' ')); local_988 = local_988 + 1) {
        }
        if (pEStack_468[local_988] == '\"') {
          if (3 < local_988) {
            strtok((char *)0x0,"\"");
          }
          pEStack_468 = strtok((char *)0x0,"\"");
        }
        else {
          pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
        }
        if ((pEStack_468 == (char *)0x0) || (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
          bLogInitialized = -2;
          goto LAB_0014ac72;
        }
        EcSnprintf(&dwNumLinkLayer,0xff,"%s",pEStack_468);
        pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
      }
      else {
        iVar5 = strcasecmp(pEStack_468,"-log");
        if (iVar5 == 0) {
          for (local_98c = 4;
              ((pEStack_468[local_98c] != '\0' && (pEStack_468[local_98c] != '\"')) &&
              (pEStack_468[local_98c] == ' ')); local_98c = local_98c + 1) {
          }
          if (pEStack_468[local_98c] == '\"') {
            if (3 < local_98c) {
              strtok((char *)0x0,"\"");
            }
            pEStack_468 = strtok((char *)0x0,"\"");
          }
          else {
            pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
          }
          if ((pEStack_468 == (char *)0x0) || (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
            bLogInitialized = -2;
            goto LAB_0014ac72;
          }
          EcSnprintf(local_578,0xff,"%s",pEStack_468);
          pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
        }
        else {
          iVar5 = strcasecmp(pEStack_468,"-t");
          if (iVar5 == 0) {
            pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
            if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
               (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
              bLogInitialized = -2;
              goto LAB_0014ac72;
            }
            lVar8 = strtol(pEStack_468,(char **)0x0,0);
            apLinkParms[4]._4_4_ = (EC_T_DWORD)lVar8;
            pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
          }
          else {
            iVar5 = strcasecmp(pEStack_468,"-auxclk");
            if (iVar5 == 0) {
              TimingDesc.bShutdown = 1;
              pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
              if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
                 (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
                bLogInitialized = -2;
                goto LAB_0014ac72;
              }
              lVar8 = strtol(pEStack_468,(char **)0x0,0);
              TimingDesc.pvTimingEvent._0_4_ = (uint)lVar8;
              pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
              if ((uint)TimingDesc.pvTimingEvent < 10) {
                TimingDesc.pvTimingEvent._0_4_ = 10;
              }
            }
            else {
              iVar5 = strcasecmp(pEStack_468,"-b");
              if (iVar5 == 0) {
                if (TimingDesc.bShutdown == 1) {
                  OsDbgMsg("Using bus cycle time %d usec from auxclock parameter\n");
                  pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                }
                else {
                  pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
                  if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
                     (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
                    bLogInitialized = -2;
                    goto LAB_0014ac72;
                  }
                  lVar8 = strtol(pEStack_468,(char **)0x0,0);
                  TimingDesc.pvTimingEvent._0_4_ = (uint)lVar8;
                  pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                }
              }
              else {
                iVar5 = strcasecmp(pEStack_468,"-a");
                if (iVar5 == 0) {
                  pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
                  if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
                     (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
                    bLogInitialized = -2;
                    goto LAB_0014ac72;
                  }
                  lVar8 = strtol(pEStack_468,(char **)0x0,0);
                  bEnaPerfJobs = (EC_T_BOOL)lVar8;
                  pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                }
                else {
                  iVar5 = strcasecmp(pEStack_468,"-v");
                  if (iVar5 == 0) {
                    pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
                    if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
                       (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
                      bLogInitialized = -2;
                      goto LAB_0014ac72;
                    }
                    lVar8 = strtol(pEStack_468,(char **)0x0,10);
                    oOsParms.pfHwTimerModifyInitialCount._0_4_ = (EC_T_INT)lVar8;
                    pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                  }
                  else {
                    iVar5 = strcasecmp(pEStack_468,"-perf");
                    if (iVar5 == 0) {
                      TimingDesc._36_4_ = 1;
                      pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                    }
                    else {
                      iVar5 = strcasecmp(pEStack_468,"-sp");
                      if (iVar5 == 0) {
                        pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),
                                                  &local_469);
                        if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
                           (iVar5 = strncmp(pEStack_468,"-",1), iVar5 == 0)) {
                          oLogging.m_pchLogDir[0xfe] = 'p';
                          oLogging.m_pchLogDir[0xff] = '\x17';
                          ptcWord._4_4_ = 0;
                          pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                        }
                        else {
                          lVar8 = strtol(pEStack_468,(char **)0x0,10);
                          oLogging.m_pchLogDir._254_2_ = SUB82(lVar8,0);
                          pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                        }
                      }
                      else {
                        iVar5 = strcasecmp(pEStack_468,"-dcmmode");
                        if (iVar5 == 0) {
                          pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),
                                                    &local_469);
                          if ((pEStack_468 == (EC_T_CHAR *)0x0) ||
                             (iVar5 = strcasecmp(pEStack_468,"off"), iVar5 != 0)) {
                            if ((pEStack_468 == (char *)0x0) ||
                               (iVar5 = strcasecmp(pEStack_468,"busshift"), iVar5 != 0)) {
                              if ((pEStack_468 == (char *)0x0) ||
                                 (iVar5 = strcasecmp(pEStack_468,"mastershift"), iVar5 != 0)) {
                                if ((pEStack_468 == (char *)0x0) ||
                                   (iVar5 = strcasecmp(pEStack_468,"masterrefclock"), iVar5 != 0)) {
                                  if ((pEStack_468 == (char *)0x0) ||
                                     (iVar5 = strcasecmp(pEStack_468,"dcx"), iVar5 != 0)) {
                                    bLogInitialized = -2;
                                    goto LAB_0014ac72;
                                  }
                                  licenseKey._4_4_ = eDcmMode_Dcx;
                                  pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                                }
                                else {
                                  licenseKey._4_4_ = eDcmMode_MasterRefClock;
                                  pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                                }
                              }
                              else {
                                licenseKey._4_4_ = eDcmMode_MasterShift;
                                pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                              }
                            }
                            else {
                              licenseKey._4_4_ = eDcmMode_BusShift;
                              pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                            }
                          }
                          else {
                            licenseKey._4_4_ = eDcmMode_Off;
                            pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                          }
                        }
                        else {
                          iVar5 = strcasecmp(pEStack_468,"-ctloff");
                          if (iVar5 == 0) {
                            licenseKey._0_4_ = 1;
                            pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                          }
                          else {
                            iVar5 = strcasecmp(pEStack_468,"-key");
                            if (iVar5 == 0) {
                              pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),
                                                        &local_469);
                              pEVar2 = pEStack_468;
                              if (pEStack_468 == (EC_T_CHAR *)0x0) {
                                bLogInitialized = -2;
                                goto LAB_0014ac72;
                              }
                            }
                            else {
                              iVar5 = strcasecmp(pEStack_468,"-c");
                              if (iVar5 == 0) {
                                GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
                                pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                              }
                              else {
                                EVar3 = CreateLinkParmsFromCmdLine
                                                  (&stack0xfffffffffffffb98,
                                                   (EC_T_CHAR **)(szFullCommandLine + 0x1f8),
                                                   &local_469,(EC_T_BOOL *)((long)&ptcWord + 4),
                                                   apLinkParms + ((ulong)(uint)apLinkParms[4] - 1));
                                if (EVar3 != 0) {
                                  bLogInitialized = -2;
                                  goto LAB_0014ac72;
                                }
                                if (1 < (uint)apLinkParms[4]) {
                                  bLogInitialized = -2;
                                  goto LAB_0014ac72;
                                }
                                apLinkParms[(ulong)(uint)apLinkParms[4] - 1]->dwIstPriority =
                                     (1 << ((byte)bEnaPerfJobs & 0x1f)) << 0x10 | 0x61;
                                apLinkParms[4]._0_4_ = (uint)apLinkParms[4] + 1;
                                pEVar2 = (EC_T_CHAR *)SigSet.__val[0xf];
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      SigSet.__val[0xf] = (unsigned_long)pEVar2;
      if (ptcWord._4_4_ != 0) {
        pEStack_468 = GetNextWord((EC_T_CHAR **)(szFullCommandLine + 0x1f8),&local_469);
      }
      ptcWord._4_4_ = 1;
    }
    CAtEmLogging::InitLogging((CAtEmLogging *)&CpuSet,0,10000,0x1d,bEnaPerfJobs,local_578,0x4000);
    bVar1 = true;
    CAtEmLogging::SetLogThreadAffinity((CAtEmLogging *)&CpuSet,bEnaPerfJobs);
    OsAddDbgMsgHook(CAtEmLogging::OsDbgMsgHookWrapper);
    CAtEmLogging::LogMsg((CAtEmLogging *)&CpuSet,"Full command line: %s\n",local_458);
    if ((char)dwNumLinkLayer == '\0') {
      pbyCnfData._4_4_ = eCnfType_GenPreopENI;
    }
    else {
      pbyCnfData._4_4_ = eCnfType_Filename;
      pEStack_588 = &dwNumLinkLayer;
      local_58c = 0x100;
    }
    if ((uint)apLinkParms[4] == 0) {
      OsDbgMsg("Syntax error: missing link layer command line parameter\n");
      bLogInitialized = -2;
    }
    else {
      iVar5 = OsSetThreadAffinity(0,1 << ((byte)bEnaPerfJobs & 0x1f));
      if (iVar5 == 0) {
        OsDbgMsg("ERROR: Set Affinity Failed!\n");
      }
      TimingDesc.pvAuxClkEvent._0_4_ = bEnaPerfJobs;
      _nVerbose = (void *)OsCreateEvent();
      if (_nVerbose == (void *)0x0) {
        OsDbgMsg("ERROR: insufficient memory to create timing event!\n");
      }
      else {
        TimingDesc.bShutdown = 1;
        iVar5 = OsAuxClkInit(bEnaPerfJobs,1000000 / (ulong)(uint)TimingDesc.pvTimingEvent,_nVerbose)
        ;
        if (iVar5 == 0) {
          if (oOsParms.pfHwTimerModifyInitialCount._4_4_ != 0) {
            OsCreateThread("tEcTimingTask",tEcTimingTask,99,0x4000,&nVerbose);
            while (TimingDesc.dwBusCycleTimeUsec == 0) {
              LinuxSleep(1);
            }
          }
          OsDbgMsg("Run demo now with cycle time %d usec\n",(uint)TimingDesc.pvTimingEvent);
          pcVar9 = "Sleep";
          if (TimingDesc.bShutdown != 0) {
            pcVar9 = "AuxClock";
          }
          OsDbgMsg("Using %s\n",pcVar9);
          if ((uint)apLinkParms[4] == 2) {
            local_9e8 = apLinkParms[0];
          }
          else {
            local_9e8 = (EC_T_LINK_PARMS *)0x0;
          }
          EVar3 = EtherCATStack((CAtEmLogging *)&CpuSet,pbyCnfData._4_4_,(EC_T_PBYTE)pEStack_588,
                                local_58c,(uint)TimingDesc.pvTimingEvent,
                                (EC_T_INT)oOsParms.pfHwTimerModifyInitialCount,apLinkParms[4]._4_4_,
                                pEStack_6c8,_nVerbose,bEnaPerfJobs,TimingDesc._36_4_,
                                oLogging.m_pchLogDir._254_2_,local_9e8,(EC_T_OS_PARMS *)&bCtlOff,
                                licenseKey._4_4_,(EC_T_BOOL)licenseKey,callbackFct,
                                (char *)SigSet.__val[0xf]);
          OsDbgMsg("---EtherCATStack finished");
          if (EVar3 == 0) {
            bLogInitialized = 0;
          }
        }
        else {
          OsDbgMsg("ERROR at auxiliary clock initialization!\n");
        }
      }
    }
  }
LAB_0014ac72:
  if (bLogInitialized == -2) {
    ShowSyntax();
  }
  OsDbgMsg("EcMasterDemoDc stop.\n");
  if (bLogInitialized != 0) {
    LinuxSleep(5000);
  }
  if (TimingDesc.dwBusCycleTimeUsec == 1) {
    TimingDesc.pvTimingEvent._4_4_ = 1;
    while (TimingDesc.dwBusCycleTimeUsec != 0) {
      LinuxSleep(1);
    }
  }
  if (TimingDesc.bShutdown != 0) {
    OsAuxClkDeinit();
  }
  if (_nVerbose != (void *)0x0) {
    OsDeleteEvent(_nVerbose);
    _nVerbose = (void *)0x0;
  }
  if (bVar1) {
    CAtEmLogging::DeinitLogging((CAtEmLogging *)&CpuSet);
  }
  OsDeinit();
  for (; (uint)apLinkParms[4] != 0; apLinkParms[4]._0_4_ = (uint)apLinkParms[4] - 1) {
    if (apLinkParms[(ulong)((uint)apLinkParms[4] - 1) - 1] != (EC_T_LINK_PARMS *)0x0) {
      free(apLinkParms[(ulong)((uint)apLinkParms[4] - 1) - 1]);
      apLinkParms[(ulong)((uint)apLinkParms[4] - 1) - 1] = (EC_T_LINK_PARMS *)0x0;
    }
  }
  return bLogInitialized;
}

Assistant:

int mainEtherCAT(int nArgc, char* ppArgv[])
#endif
{
// 	ethercat::callbackFctPtr = callbackFctPtr;
    int                     nRetVal             = APP_ERROR;
    EC_T_DWORD              dwRes               = EC_E_ERROR;
    EC_T_BOOL               bLogInitialized     = EC_FALSE;
    EC_T_CHAR               szCommandLine[COMMAND_LINE_BUFFER_LENGTH];
    EC_T_CHAR               szFullCommandLine[COMMAND_LINE_BUFFER_LENGTH];
    EC_T_BOOL               bGetNextWord        = EC_TRUE;
    EC_T_CHAR*              ptcWord             = EC_NULL;
    EC_T_CHAR               tcStorage           = '\0';

    EC_T_CHAR               szLogFileprefix[256] = {'\0'};
    EC_T_CNF_TYPE           eCnfType            = eCnfType_Unknown;
    EC_T_PBYTE              pbyCnfData          = 0;
    EC_T_DWORD              dwCnfDataLen        = 0;
    EC_T_CHAR               szENIFilename[256]  = {'\0'};
//     EC_T_DWORD              dwDuration          = 120000;
    EC_T_DWORD              dwDuration          = 0;	// 0 = no timeout
    EC_T_DWORD              dwNumLinkLayer     = 0;
    EC_T_LINK_PARMS*        apLinkParms[MAX_LINKLAYER];
#ifdef ATEMRAS_SERVER
    EC_T_WORD               wServerPort = 0xFFFF;
#endif
    CAtEmLogging            oLogging;
    EC_T_DWORD              dwCpuIndex          = 0;
    EC_T_CPUSET             CpuSet;
    EC_T_BOOL               bEnaPerfJobs        = EC_FALSE;  /* enable job measurements */
    EC_T_TIMING_DESC        TimingDesc;
#if !(defined XENOMAI)
    EC_T_BOOL               bStartTimingTask    = EC_FALSE;
#endif
    EC_T_INT                nVerbose            = 0;
#if (defined UNDER_CE) && (_WIN32_WCE >= 0x600)
    BOOL                    bRes                = FALSE;
    DWORD                   dwAuxClkSysIntr     = 0;
    DWORD                   dwWinRes            = EC_E_ERROR;
#endif
#if (defined UNDER_RTSS)
    HANDLE                  hTimer              = NULL;
    LARGE_INTEGER           liTimer;
#endif
#if (defined EC_VERSION_RTEMS)
    rtems_id                timerId;
    rtems_status_code       status;
#endif /* EC_VERSION_RTEMS */
    EC_T_OS_PARMS           oOsParms;
    EC_T_DCM_MODE           eDcmMode            = eDcmMode_BusShift;
    EC_T_BOOL               bCtlOff             = EC_FALSE;
	char* 					licenseKey			= "";

    OsMemset(apLinkParms, 0, sizeof(apLinkParms));
    OsMemset(&TimingDesc, 0, sizeof(TimingDesc));
    OsMemset(&oOsParms, 0, sizeof(EC_T_OS_PARMS));

    szCommandLine[0] = '\0';

    /* OS specific initialization */
    oOsParms.dwSize                         = sizeof(EC_T_OS_PARMS);
    oOsParms.dwSupportedFeatures            = 0xFFFFFFFF;
#if (defined WIN32) && !(defined UNDER_CE)
    SetConsoleCtrlHandler( (PHANDLER_ROUTINE)win32CtrlCHandler, TRUE );
#endif

#if (defined RTOS_32)
#ifdef ECWIN_RTOS32
    RTKernelInit(0);
    oOsParms.pfHwTimerGetInputFrequency     = Rtos32HwTimerGetInputFrequency;
    oOsParms.pfHwTimerModifyInitialCount    = Rtos32HwTimerModifyInitialCount;
#else
    RTKernelInit(4);
    RTCMOSSetSystemTime();

#ifdef RTOS_32_APIC
    if (!RTMPSetAPICMode(0))
    {
    static BYTE MPTableBuffer[1024]; // some space for the ACPI-generated table

        if (!RTMPACPITableCreate(MPTableBuffer, sizeof(MPTableBuffer), 0))
        {
            printf("RTMPACPITableCreate failed!\n");
        }
        if (!RTMPSetAPICMode(0))
        {
            printf("RTMPSetAPICMode failed!\n");
            nRetVal = APP_ERROR;
            goto Exit;
        }
    }
#endif /* RTOS_32_APIC */
    {
        UINT CPUClock         = RTSMBIOSGetCPUSpeed();
        UINT BusClockBIOS     = RTSMBIOSGetBusSpeed();
        UINT BusClockMeasured = RTMPBusFromCPUClock(CPUClock, 40000000);    /* 40M, that's 1/100 of a second on a 4GHz machine */

        OsDbgMsg("CPU Clock         : %uMHz\n""Bus Clock         : %uMHz\n""Bus Clock measured: %uMHz\n\n",
                    CPUClock,BusClockBIOS,BusClockMeasured);
    }

    /* workaround for IDE driver */
    RTMPSetIOAPICVector(0, 5, 5, 1, 1);

    /* prevent warning message "IDE driver in PIO mode */
    for (int nDevIndex = 0; nDevIndex < 8; nDevIndex++)
    {
        if (RTFDeviceList[nDevIndex].DeviceType == RTF_DEVICE_FDISK)
        {
            RTFDeviceList[nDevIndex].DeviceFlags |= RTF_DEVICE_NO_DIAG_MSG;
        }
        else if (RTFDeviceList[nDevIndex].DeviceType == 0)
        {
            break;
        }
    }
#endif
    RTKPreemptionsON();
#if (defined ATEMRAS_SERVER) && (defined EC_SOCKET_IP_SUPPORTED) && (defined INCLUDE_RTIP)
    NetInitialize();
#endif
#endif /* RTOS_32 */
#if (defined ECWIN_RTOS32)
    {
    void* pvReg = NULL;

        /* protect memory area at address 0 (detect NULL pointer access) */
        pvReg = NULL;
        RTReserveVirtualAddress(&pvReg, 0x1000, RT_MAP_NO_RELOCATE);

        /* start thread waiting for termination request */
        RTKRTLCreateThread( (RTKThreadFunction)tTerminationReq, 64, 0x1000, TF_NO_MATH_CONTEXT, NULL, "tTerminationReq" );

        printf( "you can stop the demo by typing CTRL-C or ESCAPE in the debug console\n");
    }
#endif /* ECWIN_RTOS32 */
#if (defined ECWIN)
    /* must be call before any RtosLib API call */
    RtosLibInit();
    
    /* must be call before any file open (RtosLibFile) call */
    RtosCommStart();
#endif /* ECWIN */

#if (defined VXWORKS)
    /* change VxWorks standard task priorities to optimize EtherCAT performance */
#ifndef VXWORKS_NORMAL_PRIO
    vxTaskPrioChange( "tJobTask" );
    vxTaskPrioChange( "tLogTask" );
    vxTaskPrioChange( "tNbioLog" );
    vxTaskPrioChange( "tShell" );
    vxTaskPrioChange( "tShell0" );
    vxTaskPrioChange( "tShellRem1" );
    vxTaskPrioChange( "tShellRem2" );
    vxTaskPrioChange( "tWdbTask" );
    vxTaskPrioChange( "tTelnetd" );
#endif
#if ((defined _WRS_VXWORKS_MAJOR) && (defined _WRS_VXWORKS_MINOR) && ( (_WRS_VXWORKS_MAJOR >= 7) || ((_WRS_VXWORKS_MAJOR == 6) && (_WRS_VXWORKS_MINOR >= 5)) ))
    taskPrioritySet( taskNameToId("tNet0"), RECV_THREAD_PRIO );
#else
    taskPrioritySet( taskNameToId("tNetTask"), RECV_THREAD_PRIO );
#endif
    /* redirect outputs to target shell console device */
#if (_WRS_VXWORKS_MAJOR < 7) || ! defined(_WRS_VXWORKS_MAJOR)
    int nTidTargetShell = taskNameToId("tShellRem1");
    if (-1 != nTidTargetShell)
#else
    TASK_ID nTidTargetShell = taskNameToId("tShellRem1");
    if (ERROR != taskIdVerify(nTidTargetShell))
#endif
    {
        /* redirect all outputs at the target shell */
        ioGlobalStdSet (STD_OUT, ioTaskStdGet(nTidTargetShell,STD_OUT));
        ioGlobalStdSet (STD_ERR, ioTaskStdGet(nTidTargetShell,STD_ERR));
    }
    /* sysclk always set to 1msec */
    sysClkRateSet(1000);
#endif /* VXWORKS */

#if (defined LINUX) && !(defined RTAI)
	
	
	
	
    dwRes = EnableRealtimeEnvironment();
    if (EC_E_NOERROR != dwRes)
    {
        goto Exit;
    }
    {
        sigset_t SigSet;
        int nSigNum = SIGALRM;
        sigemptyset(&SigSet);
        sigaddset(&SigSet, nSigNum);
        sigprocmask(SIG_BLOCK, &SigSet, NULL);
//         signal(SIGINT, SignalHandler);
//         signal(SIGTERM, SignalHandler);
    }
#endif /* LINUX && !RTAI */

#if (defined __INTEGRITY)
    WaitForFileSystemInitialization();
#endif

#if (defined __RCX__)
    ATEMDEMO_STARTUPPARAMETER_T* pStartup = ((ATEMDEMO_STARTUPPARAMETER_T*)pvInit);

    TCHAR* lpCmdLine = (TCHAR*)(pStartup->szParamList);
    lpCmdLine = (lpCmdLine==EC_NULL)?(TCHAR*)" ":lpCmdLine;
    tcStorage = *lpCmdLine;
#endif

#if (defined EC_VERSION_GO32)
    if (!io_Init())
    {
        OsDbgMsg("Fail to initialize Vortex86 I/O library\n");
        nRetVal = APP_ERROR;
        goto Exit;
    }
    if (!irq_Init())
    {
        OsDbgMsg("Fail to initialize Vortex86 IRQ library\n");
        io_Close();     /* Deinit IOs */
        nRetVal = APP_ERROR;
        goto Exit;
    }
#endif

#if !(defined UNDER_RTSS) && !(defined RTAI)
    /* Seed the random-number generator with current time so that
     * the numbers will be different every time we run.
     */
    srand((unsigned)OsQueryMsecCount());
#endif
    /* set running flag */
    bRun = EC_TRUE;

    /* add hook to log all EtherCAT messages. Without hook no messages will be generated! */
    OsAddDbgMsgHook(CAtEmLogging::OsDbgMsgHookWrapper);

    /* Initialize Timing Event descriptor */
    TimingDesc.bShutdown          = EC_FALSE;
    TimingDesc.bIsRunning         = EC_FALSE;
#if (defined RTAI)
    TimingDesc.dwBusCycleTimeUsec = G_dwBusCycleTimeUsec;
#else
	std::cout << "ECMASTERLIB: CYCLE_TIME: " << CYCLE_TIME << std::endl;
// 	std::cout << "ECMASTERLIB: G_dwBusCycleTimeUsec: " << G_dwBusCycleTimeUsec << std::endl;
    TimingDesc.dwBusCycleTimeUsec = CYCLE_TIME * 1000;
#endif

    /* prepare command line */
#if (defined VXWORKS)
    OsStrncpy(szCommandLine, lpCmdLine, sizeof(szCommandLine) - 1);
#elif (defined RTOS_32)
#if (defined ECWIN_RTOS32)
    {
    VMF_HANDLE hEcatKey;
    VMF_CONFIG_ADDDATA AddData;
    UINT32 dwLength = 0;

        dwRes = vmfConfigRegKeyOpenA(VMF_CONFIGREG_HKEY_OS_CURRENT, "Ecat", &hEcatKey);
        if( dwRes == RTE_SUCCESS )
        {

            dwLength = sizeof(szCommandLine);
            vmfConfigRegValueQueryA(hEcatKey, "CommandLine", NULL, NULL, (UINT8*)&szCommandLine[0], &dwLength );
            vmfConfigRegKeyClose(hEcatKey);
        }
        if ('\0' == szCommandLine[0])
        {
            /* for compatibility */
            dwLength = sizeof(szCommandLine);
            dwRes = vmfConfigQueryValue( "Ecat", "CommandLine", VMF_CONFIG_SZ_TYPE, (UINT8*)&szCommandLine[0], &dwLength, &AddData);
            if( dwRes != RTE_SUCCESS )
            {
                printf( "Cannot read EtherCAT demo command line, (EcatShm.config)\n" );
                printf( "Please, enter command line (e.g. atemDemo -v 2 -i8255x 1 1):\n" );
            }
        }
    }
#else
    OsStrncpy(szCommandLine, GetCommandLine(), sizeof(szCommandLine) - 1);
#endif /* !ECWIN_RTOS32 */
#elif (defined RTAI)
    OsStrncpy(szCommandLine, "-i8254x 1 1 -v 1 -t 15000 ", sizeof(szCommandLine) - 1);
#elif (defined __TKERNEL) && (defined __arm__)
    /*-fixed command line for T-Kernel on ARM */
    OsStrncpy(szCommandLine, "-l9218i 1 -v 1 -t 0 -f eni.xml", sizeof(szCommandLine) - 1);
#elif (defined EC_VERSION_SYSBIOS) || (defined EC_VERSION_RIN32M3) || (defined EC_VERSION_XILINX_STANDALONE) ||\
    (defined EC_VERSION_ETKERNEL) || (defined EC_VERSION_RZT1) || (defined EC_VERSION_RZGNOOS) || (defined EC_VERSION_JSLWARE)
    OsStrncpy(szCommandLine, DEMO_PARAMETERS, sizeof(szCommandLine) - 1);
#elif (defined EC_VERSION_RTEMS)
    /* copy cmdline without the applications name(first token) */
    OsStrncpy(szCommandLine, strchr(bsp_boot_cmdline,' '),sizeof(szCommandLine) - 1);
#else
    /* build szCommandLine from argument list */
    {
    EC_T_CHAR* pcStrCur   = szCommandLine;
    EC_T_INT   nStrRemain = COMMAND_LINE_BUFFER_LENGTH;
#if (defined UNDER_CE)
    EC_T_CHAR  szStrFormat[] = "%S"; /* convert UNICODE to multibyte */
#else
    EC_T_CHAR  szStrFormat[] = "%s";
#endif
        /* build szCommandLine from argument list, skipping executable name */
        for (nArgc--, ppArgv++; nArgc > 0; nArgc--, ppArgv++)
        {
        EC_T_BOOL bIsFileName = EC_FALSE;

            /* insert next argument */
            OsSnprintf(pcStrCur, nStrRemain - 1, szStrFormat, *ppArgv);

            /* check for file name */
            if (0 == OsStrcmp(pcStrCur, "-f"))
            {
                bIsFileName = EC_TRUE;
            }
            /* adjust string cursor */
            nStrRemain -= (EC_T_INT)OsStrlen(pcStrCur);
            pcStrCur = pcStrCur + OsStrlen(pcStrCur);

            /* insert space */
            OsStrncpy(pcStrCur, " ", nStrRemain - 1); nStrRemain--; pcStrCur++;

            if (bIsFileName && (1 < nArgc))
            {
                /* move to next arg (ENI file name) */
                nArgc--; ppArgv++;

                /* insert quotation mark */
                OsStrncpy(pcStrCur, "\"", nStrRemain - 1); nStrRemain--; pcStrCur++;

                /* insert ENI file name */
                OsSnprintf(pcStrCur, nStrRemain - 1, szStrFormat, *ppArgv); nStrRemain -= (EC_T_INT)OsStrlen(pcStrCur);
                pcStrCur = pcStrCur + OsStrlen(pcStrCur);

                /* insert quotation mark */
                OsStrncpy(pcStrCur, "\" ", nStrRemain - 1); nStrRemain--; pcStrCur++;
            }
        }
    }
#endif
    /* backup full command line */
    OsStrncpy(szFullCommandLine, szCommandLine, sizeof(szFullCommandLine) - 1);

    /* parse command line */
    for (ptcWord = OsStrtok(szCommandLine, " "); ptcWord != EC_NULL;)
    {
        if( 0 == OsStricmp( ptcWord, "-f") )
        {
            EC_T_INT nPtcWordIndex = 3;

            /* Search for the start of the config file name. The config file
               name may start with quotation marks because of blanks in the filename */
            while(ptcWord[nPtcWordIndex] != '\0')
            {
                if(ptcWord[nPtcWordIndex] == '\"' || ptcWord[nPtcWordIndex] != ' ')
                {
                    break;
                }
                nPtcWordIndex++;
            }

            /* Depending of a config file name within quotation marks (or without
               quotation marks) extract the filename */
            if(ptcWord[nPtcWordIndex] == '\"')
            {
                /* Check if the strtok position is already correct */
                if(nPtcWordIndex > 3)
                {
                    /* More than 1 blank before -f. Correct strtok position. */
                    OsStrtok(EC_NULL,"\"");
                }

                /* Now extract the config file name */
                ptcWord = OsStrtok(EC_NULL,"\"");
            }
            else
            {
                /* Extract the config file name if it was not set within quotation marks */
                ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
            }

            if (
                (ptcWord == EC_NULL)
             || (OsStrncmp( ptcWord, "-", 1) == 0)
               )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            OsSnprintf(szENIFilename, sizeof(szENIFilename) - 1, "%s", ptcWord);
        }
        else if( 0 == OsStricmp( ptcWord, "-log") )
        {
            EC_T_INT nPtcWordIndex = 4;

            /* Search for the start of the config file name. The config file
               name may start with quotation marks because of blanks in the filename */
            while(ptcWord[nPtcWordIndex] != '\0')
            {
                if(ptcWord[nPtcWordIndex] == '\"' || ptcWord[nPtcWordIndex] != ' ')
                {
                    break;
                }
                nPtcWordIndex++;
            }

            /* Depending of a config file name within quotation marks (or without
               quotation marks) extract the filename */
            if(ptcWord[nPtcWordIndex] == '\"')
            {
                /* Check if the strtok position is already correct */
                if(nPtcWordIndex > 3)
                {
                    /* More than 1 blank before -f. Correct strtok position. */
                    OsStrtok(EC_NULL,"\"");
                }

                /* Now extract the config file name */
                ptcWord = OsStrtok(EC_NULL,"\"");
            }
            else
            {
                /* Extract the config file name if it was not set within quotation marks */
                ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
            }

            if (
                (ptcWord == EC_NULL)
             || (OsStrncmp( ptcWord, "-", 1) == 0)
               )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            OsSnprintf(szLogFileprefix, sizeof(szLogFileprefix) - 1, "%s", ptcWord);
        }
        else if (OsStricmp( ptcWord, "-t") == 0)
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
            if (
                (ptcWord == EC_NULL)
             || (OsStrncmp( ptcWord, "-", 1) == 0)
               )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            dwDuration = OsStrtol(ptcWord, EC_NULL, 0);
        }
        else if( OsStricmp( ptcWord, "-auxclk") == 0)
        {
#if (defined AUXCLOCK_SUPPORTED)
            TimingDesc.bUseAuxClock = EC_TRUE;
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if (
                (ptcWord == EC_NULL)
                || (OsStrncmp( ptcWord, "-", 1) == 0)
                )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            TimingDesc.dwBusCycleTimeUsec = OsStrtol(ptcWord, EC_NULL, 0);
            if( TimingDesc.dwBusCycleTimeUsec < 10 )
            {
                TimingDesc.dwBusCycleTimeUsec = 10;
            }
#else
            OsDbgMsg( "Auxiliary clock not supported by this operating system!)\n" );
            goto Exit;
#endif
        }
        else if (OsStricmp( ptcWord, "-b") == 0)
        {
#if (defined AUXCLOCK_SUPPORTED)
            if( EC_TRUE == TimingDesc.bUseAuxClock )
            {
                OsDbgMsg( "Using bus cycle time %d usec from auxclock parameter\n", TimingDesc.dwBusCycleTimeUsec );
            }
            else
#endif
            {
                ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
                if (
                    (ptcWord == EC_NULL)
                 || (OsStrncmp( ptcWord, "-", 1) == 0)
                   )
                {
                    nRetVal = SYNTAX_ERROR;
                    goto Exit;
                }
                TimingDesc.dwBusCycleTimeUsec = OsStrtol(ptcWord, EC_NULL, 0);
            }
        }
        else if (OsStricmp( ptcWord, "-a") == 0)
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if (
                (ptcWord == EC_NULL)
                || (OsStrncmp( ptcWord, "-", 1) == 0)
                )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            dwCpuIndex = OsStrtol(ptcWord, EC_NULL, 0);
        }
        else if (OsStricmp( ptcWord, "-v") == 0)
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if (
                (ptcWord == EC_NULL)
                || (OsStrncmp( ptcWord, "-", 1) == 0)
                )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            nVerbose = OsStrtol(ptcWord, EC_NULL, 10);
        }
        else if (OsStricmp( ptcWord, "-perf") == 0)
        {
            bEnaPerfJobs = EC_TRUE;
        }
#if (defined ATEMRAS_SERVER)
        else if( OsStricmp(ptcWord, "-sp") == 0 )
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if ((ptcWord == NULL) || (OsStrncmp(ptcWord, "-", 1) == 0))
            {
                wServerPort  = ATEMRAS_DEFAULT_PORT;

                /* optional sub parameter not found, use the current word for the next parameter */
                bGetNextWord = EC_FALSE;
            }
            else
            {
                wServerPort = (EC_T_WORD)OsStrtol(ptcWord, EC_NULL, 10);
            }
        }
#endif
        else if (OsStricmp(ptcWord, "-dcmmode") == 0)
        {
            /* Extract the config file name if it was not set within quotation marks */
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);

            if      ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "off") == 0))           eDcmMode = eDcmMode_Off;
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "busshift") == 0))       eDcmMode = eDcmMode_BusShift;
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "mastershift") == 0))    eDcmMode = eDcmMode_MasterShift;
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "masterrefclock") == 0)) eDcmMode = eDcmMode_MasterRefClock;
#if (defined INCLUDE_DCX)
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "dcx") == 0))            eDcmMode = eDcmMode_Dcx;
#endif
            else
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
        }
        else if (OsStricmp( ptcWord, "-ctloff") == 0)
        {
            bCtlOff = EC_TRUE;
        }
        else if (OsStricmp(ptcWord, "-key") == 0)
        {
            /* Extract the config file name if it was not set within quotation marks */
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);

            if      (EC_NULL != ptcWord)           licenseKey = ptcWord;
            else
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
        }
        else if (OsStricmp(ptcWord, "-c") == 0)
        {
            /* Ignored in ecmasterlib 
			 * Used for EEROS HAL */
			GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
        }
        else
        {
           dwRes = CreateLinkParmsFromCmdLine(&ptcWord, (EC_T_CHAR**)&szCommandLine, &tcStorage, &bGetNextWord, &apLinkParms[dwNumLinkLayer]);
           if (EC_E_NOERROR != dwRes)
           {
               nRetVal = SYNTAX_ERROR;
               goto Exit;
           }
           if (dwNumLinkLayer > 1)
           {
               nRetVal = SYNTAX_ERROR;
               goto Exit;
           }
           else
           {
#ifdef LINUX
               EC_CPUSET_ZERO(CpuSet);
               EC_CPUSET_SET(CpuSet, dwCpuIndex);
               apLinkParms[dwNumLinkLayer]->dwIstPriority = (CpuSet << 16) | RECV_THREAD_PRIO;
#else
               apLinkParms[dwNumLinkLayer]->dwIstPriority = RECV_THREAD_PRIO;
#endif
               dwNumLinkLayer++;
           }
        }